

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::TiledInputFile::~TiledInputFile(TiledInputFile *this)

{
  IStream *pIVar1;
  pointer ppTVar2;
  char *pcVar3;
  Data *this_00;
  size_t i;
  ulong uVar4;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__TiledInputFile_003668a8;
  this_00 = this->_data;
  if (this_00->memoryMapped == false) {
    for (uVar4 = 0;
        ppTVar2 = (this_00->tileBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this_00->tileBuffers).
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3);
        uVar4 = uVar4 + 1) {
      pcVar3 = ppTVar2[uVar4]->buffer;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
        this_00 = this->_data;
      }
    }
  }
  if ((this_00->_deleteStream == true) &&
     (pIVar1 = this_00->_streamData->is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
    this_00 = this->_data;
  }
  if (this_00->partNumber == -1) {
    operator_delete(this_00->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 == (Data *)0x0) {
      this_00 = (Data *)0x0;
      goto LAB_0013be12;
    }
  }
  Data::~Data(this_00);
LAB_0013be12:
  operator_delete(this_00,0x180);
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

TiledInputFile::~TiledInputFile ()
{
    if (!_data->memoryMapped)
        for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            delete [] _data->tileBuffers[i]->buffer;

    if (_data->_deleteStream)
        delete _data->_streamData->is;

    if (_data->partNumber == -1)
        delete _data->_streamData;

    delete _data;
}